

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::updateCursor(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  QMdiSubWindow *style;
  OperationInfo *pOVar2;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *q;
  QWidget *in_stack_ffffffffffffffb8;
  byte local_39;
  QMdiSubWindowPrivate *this_00;
  QCursor local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  style = q_func(in_RDI);
  QWidget::style(in_stack_ffffffffffffffb8);
  bVar1 = isMacStyle((QStyle *)style);
  if (!bVar1) {
    if (in_RDI->currentOperation == None) {
      QWidget::unsetCursor((QWidget *)in_RDI);
    }
    else {
      local_39 = 1;
      if (in_RDI->currentOperation != Move) {
        local_10._M_node =
             (_Base_ptr)
             QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::find
                       ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>
                         *)this_00,(Operation *)style);
        pOVar2 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::
                 iterator::value((iterator *)0x62d427);
        local_39 = pOVar2->hover;
      }
      if ((local_39 & 1) != 0) {
        QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::find
                  ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)
                   this_00,(Operation *)style);
        pOVar2 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::
                 iterator::value((iterator *)0x62d46b);
        QCursor::QCursor(&local_18,pOVar2->cursorShape);
        QWidget::setCursor((QWidget *)this_00,(QCursor *)style);
        QCursor::~QCursor(&local_18);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::updateCursor()
{
#ifndef QT_NO_CURSOR
    Q_Q(QMdiSubWindow);
    if (isMacStyle(q->style()))
        return;

    if (currentOperation == None) {
        q->unsetCursor();
        return;
    }

    if (currentOperation == Move || operationMap.find(currentOperation).value().hover) {
        q->setCursor(operationMap.find(currentOperation).value().cursorShape);
        return;
    }
#endif
}